

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O3

int CVmObjString::getp_urlEncode(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_val_t *pvVar3;
  int iVar4;
  vm_obj_id_t vVar5;
  ulong uVar6;
  byte *pbVar7;
  byte bVar8;
  byte bVar9;
  size_t byte_size;
  long lVar10;
  ulong uVar11;
  
  if (getp_urlEncode(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_urlEncode();
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,argc,&getp_urlEncode::desc);
  pvVar3 = sp_;
  if (iVar4 == 0) {
    uVar2 = *(undefined4 *)&self_val->field_0x4;
    aVar1 = self_val->val;
    sp_ = sp_ + 1;
    pvVar3->typ = self_val->typ;
    *(undefined4 *)&pvVar3->field_0x4 = uVar2;
    pvVar3->val = aVar1;
    uVar11 = (ulong)*(ushort *)str;
    if (uVar11 == 0) {
      vVar5 = create(0,0);
      retval->typ = VM_OBJ;
      (retval->val).obj = vVar5;
    }
    else {
      uVar6 = 0;
      byte_size = 0;
      do {
        bVar8 = str[uVar6 + 2];
        if (((0x3f < bVar8 - 0x20) ||
            (lVar10 = 1, (0x8000000000002001U >> ((ulong)(bVar8 - 0x20) & 0x3f) & 1) == 0)) &&
           (lVar10 = (ulong)(0x19 < (byte)((bVar8 & 0xdf) + 0xbf)) * 2 + 1,
           (byte)(bVar8 - 0x30) < 10)) {
          lVar10 = 1;
        }
        byte_size = byte_size + lVar10;
        uVar6 = uVar6 + 1;
      } while (uVar11 != uVar6);
      vVar5 = create(0,byte_size);
      retval->typ = VM_OBJ;
      (retval->val).obj = vVar5;
      if (uVar11 != 0) {
        pbVar7 = (byte *)(*(long *)((long)&G_obj_table_X.pages_[vVar5 >> 0xc][vVar5 & 0xfff].ptr_ +
                                   8) + 2);
        uVar6 = 0;
        do {
          bVar8 = str[uVar6 + 2];
          if ((bVar8 == 0x5f) || (bVar8 == 0x2d)) {
LAB_002828a1:
            *pbVar7 = bVar8;
LAB_002828a3:
            pbVar7 = pbVar7 + 1;
          }
          else {
            if (bVar8 == 0x20) {
              *pbVar7 = 0x2b;
              goto LAB_002828a3;
            }
            if (((byte)(bVar8 - 0x30) < 10) || ((byte)((bVar8 & 0xdf) + 0xbf) < 0x1a))
            goto LAB_002828a1;
            bVar9 = (bVar8 >> 4) + 0x37;
            if (bVar8 < 0xa0) {
              bVar9 = (bVar8 >> 4) + 0x30;
            }
            *pbVar7 = 0x25;
            pbVar7[1] = bVar9;
            bVar8 = bVar8 & 0xf;
            bVar9 = bVar8 + 0x37;
            if (bVar8 < 10) {
              bVar9 = bVar8 + 0x30;
            }
            pbVar7[2] = bVar9;
            pbVar7 = pbVar7 + 3;
          }
          uVar6 = uVar6 + 1;
        } while (uVar11 != uVar6);
      }
    }
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjString::getp_urlEncode(VMG_ vm_val_t *retval,
                                 const vm_val_t *self_val,
                                 const char *str, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* save my own value for gc protection */
    G_stk->push(self_val);

    /* get the length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* scan the string and determine the size of the expansion */
    size_t outlen;
    const char *p;
    size_t rem;
    for (outlen = 0, p = str, rem = len ; rem != 0 ; ++p, --rem)
    {
        /* 
         *   if this is a space, letter, digit, or '-' or '_', it requires
         *   one byte in the output; otherwise it requires three bytes for
         *   the "%xx" sequence 
         */
        char c = *p;
        if (c == ' ' || c == '-' || c == '_'
            || (c >= 'a' && c <= 'z')
            || (c >= 'A' && c <= 'Z')
            || (c >= '0' && c <= '9'))
            outlen += 1;
        else
            outlen += 3;
    }

    /* allocate the return string */
    retval->set_obj(create(vmg_ FALSE, outlen));
    char *dst =
        ((CVmObjString *)vm_objp(vmg_ retval->val.obj))->cons_get_buf();

    /* build the return string */
    for (p = str, rem = len ; rem != 0 ; ++p, --rem)
    {
        /* translate this byte */
        char c = *p;
        if (c == ' ')
        {
            /* translate ' ' to '+' */
            *dst++ = '+';
        }
        else if (c == '-' || c == '_'
                 || (c >= 'a' && c <= 'z')
                 || (c >= 'A' && c <= 'Z')
                 || (c >= '0' && c <= '9'))
        {
            /* letter, digit, '-', '_' - leave unchanged */
            *dst++ = c;
        }
        else
        {
            /* translate anything else to a %xx sequence */
            *dst++ = '%';
            byte_to_xdigits(dst, (unsigned char)c);
            dst += 2;
        }
    }

    /* discard gc protection */
    G_stk->discard(1);

    /* done */
    return TRUE;
}